

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringHelper.cpp
# Opt level: O2

void __thiscall
phpconvert::StringHelper::regexReplace(StringHelper *this,string *target,string *from,string *to)

{
  match_flag_type in_R9D;
  regex re;
  undefined1 local_60 [16];
  basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> local_50 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  boost::basic_regex<char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,boost::regex_traits<char,boost::cpp_regex_traits<char>>> *)local_60,
             from,0);
  std::__cxx11::string::string((string *)local_50,(string *)to);
  boost::
  regex_replace<boost::regex_traits<char,boost::cpp_regex_traits<char>>,char,std::__cxx11::string>
            (&local_30,(boost *)target,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2000000,in_R9D);
  std::__cxx11::string::operator=((string *)target,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)local_50);
  boost::detail::shared_count::~shared_count((shared_count *)(local_60 + 8));
  return;
}

Assistant:

void StringHelper::regexReplace(string& target, string& from, string& to) {
	boost::regex re(from);
	target = boost::regex_replace(target, re, to,
			boost::match_default | boost::format_all);
}